

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

UBool __thiscall
icu_63::MessagePatternList<double,_8>::ensureCapacityForOneMore
          (MessagePatternList<double,_8> *this,int32_t oldLength,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  double *pdVar3;
  UErrorCode *errorCode_local;
  int32_t oldLength_local;
  MessagePatternList<double,_8> *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    iVar2 = MaybeStackArray<double,_8>::getCapacity(&this->a);
    if ((iVar2 <= oldLength) &&
       (pdVar3 = MaybeStackArray<double,_8>::resize(&this->a,oldLength << 1,oldLength),
       pdVar3 == (double *)0x0)) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
      return '\0';
    }
    this_local._7_1_ = '\x01';
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool
MessagePatternList<T, stackCapacity>::ensureCapacityForOneMore(int32_t oldLength, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return FALSE;
    }
    if(a.getCapacity()>oldLength || a.resize(2*oldLength, oldLength)!=NULL) {
        return TRUE;
    }
    errorCode=U_MEMORY_ALLOCATION_ERROR;
    return FALSE;
}